

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_open_journal(Pager *pPager)

{
  Bitvec *pBVar1;
  Pager *in_RDI;
  int nSpill;
  int flags;
  sqlite3_vfs *pVfs;
  int rc;
  Bitvec *p;
  uint in_stack_ffffffffffffffe8;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = 0;
  p = (Bitvec *)in_RDI->pVfs;
  if (in_RDI->errCode == 0) {
    if ((in_RDI->pWal == (Wal *)0x0) && (in_RDI->journalMode != '\x02')) {
      pBVar1 = sqlite3BitvecCreate((u32)((ulong)p >> 0x20));
      in_RDI->pInJournal = pBVar1;
      if (in_RDI->pInJournal == (Bitvec *)0x0) {
        return 7;
      }
      if (in_RDI->jfd->pMethods == (sqlite3_io_methods *)0x0) {
        if (in_RDI->journalMode == '\x04') {
          sqlite3MemJournalOpen((sqlite3_file *)0x16b360);
        }
        else {
          if (in_RDI->tempFile == '\0') {
            jrnlBufferSize(in_RDI);
          }
          iVar2 = databaseIsUnmoved((Pager *)p);
          if (iVar2 == 0) {
            iVar2 = sqlite3JournalOpen((sqlite3_vfs *)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,(char *)in_RDI,
                                       (sqlite3_file *)(ulong)in_stack_ffffffffffffffe8,
                                       (int)((ulong)p >> 0x20),(int)p);
          }
        }
      }
      if (iVar2 == 0) {
        in_RDI->nRec = 0;
        in_RDI->journalOff = 0;
        in_RDI->setSuper = '\0';
        in_RDI->journalHdr = 0;
        iVar2 = writeJournalHdr(in_RDI);
      }
    }
    if (iVar2 == 0) {
      in_RDI->eState = '\x03';
    }
    else {
      sqlite3BitvecDestroy(p);
      in_RDI->pInJournal = (Bitvec *)0x0;
      in_RDI->journalOff = 0;
    }
  }
  else {
    iVar2 = in_RDI->errCode;
  }
  return iVar2;
}

Assistant:

static int pager_open_journal(Pager *pPager){
  int rc = SQLITE_OK;                        /* Return code */
  sqlite3_vfs * const pVfs = pPager->pVfs;   /* Local cache of vfs pointer */

  assert( pPager->eState==PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  assert( pPager->pInJournal==0 );

  /* If already in the error state, this function is a no-op.  But on
  ** the other hand, this routine is never called if we are already in
  ** an error state. */
  if( NEVER(pPager->errCode) ) return pPager->errCode;

  if( !pagerUseWal(pPager) && pPager->journalMode!=PAGER_JOURNALMODE_OFF ){
    pPager->pInJournal = sqlite3BitvecCreate(pPager->dbSize);
    if( pPager->pInJournal==0 ){
      return SQLITE_NOMEM_BKPT;
    }

    /* Open the journal file if it is not already open. */
    if( !isOpen(pPager->jfd) ){
      if( pPager->journalMode==PAGER_JOURNALMODE_MEMORY ){
        sqlite3MemJournalOpen(pPager->jfd);
      }else{
        int flags = SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE;
        int nSpill;

        if( pPager->tempFile ){
          flags |= (SQLITE_OPEN_DELETEONCLOSE|SQLITE_OPEN_TEMP_JOURNAL);
          flags |= SQLITE_OPEN_EXCLUSIVE;
          nSpill = sqlite3Config.nStmtSpill;
        }else{
          flags |= SQLITE_OPEN_MAIN_JOURNAL;
          nSpill = jrnlBufferSize(pPager);
        }

        /* Verify that the database still has the same name as it did when
        ** it was originally opened. */
        rc = databaseIsUnmoved(pPager);
        if( rc==SQLITE_OK ){
          rc = sqlite3JournalOpen (
              pVfs, pPager->zJournal, pPager->jfd, flags, nSpill
          );
        }
      }
      assert( rc!=SQLITE_OK || isOpen(pPager->jfd) );
    }


    /* Write the first journal header to the journal file and open
    ** the sub-journal if necessary.
    */
    if( rc==SQLITE_OK ){
      /* TODO: Check if all of these are really required. */
      pPager->nRec = 0;
      pPager->journalOff = 0;
      pPager->setSuper = 0;
      pPager->journalHdr = 0;
      rc = writeJournalHdr(pPager);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3BitvecDestroy(pPager->pInJournal);
    pPager->pInJournal = 0;
    pPager->journalOff = 0;
  }else{
    assert( pPager->eState==PAGER_WRITER_LOCKED );
    pPager->eState = PAGER_WRITER_CACHEMOD;
  }

  return rc;
}